

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_ru_u_row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>>
               (void)

{
  pool<boost::default_user_allocator_malloc_free> *ppVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  int iVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  pointer witness;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  column_content<typename_Matrix<RU_rep_options_with_row_access<true,_(Column_types)7,_true,_true,_true,_true,_true,_true>_>::Column>
  orderedRows;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
  m;
  allocator_type local_289;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_288;
  undefined8 local_254;
  undefined4 local_24c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_248;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>_>
  *local_230;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_228;
  pool<boost::default_user_allocator_malloc_free> *local_210;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>
  local_208;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>>>
            ();
  local_210 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_210->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_210->list).ptr = (char *)0x0;
  (local_210->list).sz = 0;
  local_210->requested_size = 0x30;
  local_210->next_size = 0x20;
  local_210->start_size = 0x20;
  local_210->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>>
              *)&local_208,&local_228,(Column_settings *)local_210);
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>_>
        *)0x0;
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>_>
        *)0x0;
  local_248.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_254 = (ulong)local_254._4_4_ << 0x20;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_254;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l,&local_289);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  if ((pointer)local_288._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._M_impl._0_8_,
                    (long)local_288._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_288._M_impl._0_8_);
  }
  local_254 = CONCAT44(local_254._4_4_,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_254;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l_00,&local_289);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  if ((pointer)local_288._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._M_impl._0_8_,
                    (long)local_288._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_288._M_impl._0_8_);
  }
  local_254 = CONCAT44(local_254._4_4_,2);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_254;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l_01,&local_289);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  if ((pointer)local_288._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._M_impl._0_8_,
                    (long)local_288._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_288._M_impl._0_8_);
  }
  local_254 = CONCAT44(local_254._4_4_,3);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_254;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l_02,&local_289);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  if ((pointer)local_288._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._M_impl._0_8_,
                    (long)local_288._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_288._M_impl._0_8_);
  }
  local_254 = CONCAT44(local_254._4_4_,4);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_254;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l_03,&local_289);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  if ((pointer)local_288._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._M_impl._0_8_,
                    (long)local_288._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_288._M_impl._0_8_);
  }
  local_254 = 0x400000003;
  local_24c = 5;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_254;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l_04,&local_289);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  if ((pointer)local_288._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._M_impl._0_8_,
                    (long)local_288._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_288._M_impl._0_8_);
  }
  local_254 = CONCAT44(local_254._4_4_,6);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_254;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l_05,&local_289);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  if ((pointer)local_288._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._M_impl._0_8_,
                    (long)local_288._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_288._M_impl._0_8_);
  }
  local_288._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_288 + 8);
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar4 = 0;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_230 = local_248.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    witness = local_248.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear(&local_288);
      local_254 = CONCAT44(local_254._4_4_,iVar4);
      plVar2 = (node_ptr)
               std::
               map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
               ::at(local_208.mirrorMatrixU_.super_Matrix_row_access_option.rows_,
                    (key_type *)&local_254);
      for (plVar3 = (((type *)&plVar2->next_)->data_).root_plus_size_.m_header.super_node.next_;
          plVar3 != plVar2;
          plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_) {
        local_254 = CONCAT44(local_254._4_4_,*(undefined4 *)&((type *)&plVar3[-1].prev_)->data_);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&local_288,(uint *)&local_254);
      }
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>_>
                          *)&local_288);
      iVar4 = iVar4 + 1;
      witness = witness + 1;
    } while (witness != local_230);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_288);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_248);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>
  ::reset(&local_208,(Column_settings *)local_210);
  ppVar1 = local_210;
  if (local_210 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_210);
    operator_delete(ppVar1,0x38);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>
  ::~RU_matrix(&local_208);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_228);
  return;
}

Assistant:

void test_ru_u_row_access() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_z2) {
    rows.push_back({0});
    rows.push_back({1});
    rows.push_back({2});
    rows.push_back({3});
    rows.push_back({4});
    rows.push_back({3, 4, 5});
    rows.push_back({6});
  } else {
    rows.push_back({{0, 1}});
    rows.push_back({{1, 1}});
    rows.push_back({{2, 1}});
    rows.push_back({{3, 1}, {5, 4}});
    rows.push_back({{4, 1}, {5, 4}});
    rows.push_back({{5, 1}});
    rows.push_back({{6, 1}});
  }

  column_content<typename Matrix::Column> orderedRows;
  unsigned int i = 0;
  for (auto& r : rows) {
    orderedRows.clear();
    for (const auto& entry : m.get_row(i++, false)) {
      if constexpr (Matrix::Option_list::is_z2) {
        orderedRows.insert(entry.get_column_index());
      } else {
        orderedRows.insert({entry.get_column_index(), entry.get_element()});
      }
    }
    test_column_equality<typename Matrix::Column>(r, orderedRows);
  }
}